

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::Read
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this,
          TPZStream *buf,void *context)

{
  TPZSavable *pTVar1;
  TPZStepSolver<std::complex<double>_> *pTVar2;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator=
            (&this->fAssemble,
             (TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)((long)context + 0x40));
  if (this != (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *)
              context) {
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>>>>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>>>>>
              ((list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>>>>>
                *)&this->fGlobal,*(undefined8 *)((long)context + 0x20),(long)context + 0x20);
  }
  (*buf->_vptr_TPZStream[0x1f])(buf,&this->fNumCoarse,1);
  (*buf->_vptr_TPZStream[0x1d])(buf,&this->fNumThreads,1);
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar2 = (TPZStepSolver<std::complex<double>_> *)0x0;
  }
  else {
    pTVar2 = (TPZStepSolver<std::complex<double>_> *)
             __dynamic_cast(pTVar1,&TPZSavable::typeinfo,
                            &TPZStepSolver<std::complex<double>>::typeinfo,0);
  }
  this->fCoarse = pTVar2;
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf,context);
    TPZDohrMatrix<TVar,TSubStruct> *ptr = (TPZDohrMatrix<TVar,TSubStruct> *)(context);
    fAssemble = ptr->fAssembly;
    fGlobal = ptr->SubStructures();
    buf.Read(&fNumCoarse);
    buf.Read(&fNumThreads);
    fCoarse = dynamic_cast<TPZStepSolver<TVar> *>(TPZPersistenceManager::GetInstance(&buf));
}